

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindPrintfFunction
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ulong uVar1;
  LogicalTypeId LVar2;
  size_type sVar3;
  pointer pEVar4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this;
  long in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  idx_t i;
  value_type *in_stack_ffffffffffffff78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_ffffffffffffff80;
  LogicalType *in_stack_ffffffffffffff88;
  LogicalType local_40 [24];
  ulong local_28;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_28 = 1; uVar1 = local_28,
      sVar3 = std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size(local_20), uVar1 < sVar3; local_28 = local_28 + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_ffffffffffffff80);
    LVar2 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
    this = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
           (ulong)(byte)(LVar2 - UNKNOWN);
    switch(this) {
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    default:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x8:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x9:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0xa:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0xb:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0xc:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x13:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x14:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x15:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x17:
      in_stack_ffffffffffffff80 =
           (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_18 + 0x48);
      in_stack_ffffffffffffff88 = local_40;
      duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff88,VARCHAR);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      duckdb::LogicalType::~LogicalType(local_40);
      break;
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x1a:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x1b:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x1c:
    case (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x1d:
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>(this,(LogicalTypeId *)in_stack_ffffffffffffff88);
    }
  }
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindPrintfFunction(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	for (idx_t i = 1; i < arguments.size(); i++) {
		switch (arguments[i]->return_type.id()) {
		case LogicalTypeId::BOOLEAN:
			bound_function.arguments.emplace_back(LogicalType::BOOLEAN);
			break;
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
			bound_function.arguments.emplace_back(LogicalType::BIGINT);
			break;
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
			bound_function.arguments.emplace_back(LogicalType::UBIGINT);
			break;
		case LogicalTypeId::FLOAT:
		case LogicalTypeId::DOUBLE:
			bound_function.arguments.emplace_back(LogicalType::DOUBLE);
			break;
		case LogicalTypeId::VARCHAR:
			bound_function.arguments.push_back(LogicalType::VARCHAR);
			break;
		case LogicalTypeId::DECIMAL:
			// decimal type: add cast to double
			bound_function.arguments.emplace_back(LogicalType::DOUBLE);
			break;
		case LogicalTypeId::UNKNOWN:
			// parameter: accept any input and rebind later
			bound_function.arguments.emplace_back(LogicalType::ANY);
			break;
		default:
			// all other types: add cast to string
			bound_function.arguments.emplace_back(LogicalType::VARCHAR);
			break;
		}
	}
	return nullptr;
}